

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_hash.c
# Opt level: O1

void beltHashStart(void *state)

{
  octet *src;
  
  *(undefined8 *)((long)state + 0x10) = 0;
  *(undefined8 *)((long)state + 0x18) = 0;
  *(undefined8 *)state = 0;
  *(undefined8 *)((long)state + 8) = 0;
  src = beltH();
  u32From((u32 *)((long)state + 0x30),src,0x20);
  *(undefined8 *)((long)state + 0x90) = 0;
  return;
}

Assistant:

void beltHashStart(void* state)
{
	belt_hash_st* st = (belt_hash_st*)state;
	ASSERT(memIsValid(state, beltHash_keep()));
	// len || s <- 0
	beltBlockSetZero(st->ls);
	beltBlockSetZero(st->ls + 4);
	// h <- B194...0D
	u32From(st->h, beltH(), 32);
	// нет накопленнных данных
	st->filled = 0;
}